

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O2

void hadamard_col8_sse2(__m128i *in,int iter)

{
  short sVar1;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar2 [16];
  __m128i alVar3;
  short sVar11;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar12 [16];
  __m128i alVar13;
  short sVar21;
  short sVar29;
  undefined4 uVar22;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 auVar26 [12];
  short sVar34;
  short sVar35;
  __m128i alVar28;
  short sVar36;
  short sVar44;
  undefined4 uVar37;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  undefined1 auVar41 [12];
  short sVar49;
  short sVar50;
  __m128i alVar43;
  short sVar51;
  short sVar60;
  undefined4 uVar52;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  undefined1 auVar56 [12];
  short sVar65;
  short sVar66;
  undefined1 auVar58 [16];
  __m128i alVar59;
  short sVar67;
  short sVar76;
  undefined4 uVar68;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  undefined1 auVar72 [12];
  short sVar81;
  short sVar82;
  undefined1 auVar74 [16];
  __m128i alVar75;
  short sVar83;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  __m128i alVar84;
  short sVar92;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  undefined1 auVar93 [16];
  undefined1 auVar99 [16];
  __m128i alVar100;
  undefined1 auVar108 [16];
  undefined1 auVar114 [16];
  short sVar115;
  short sVar122;
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  short sVar128;
  undefined1 auVar116 [16];
  undefined1 auVar121 [16];
  short sVar129;
  short sVar130;
  short sVar136;
  short sVar137;
  short sVar138;
  short sVar139;
  short sVar140;
  short sVar141;
  short sVar142;
  short sVar143;
  short sVar144;
  short sVar145;
  short sVar146;
  short sVar147;
  short sVar148;
  short sVar149;
  undefined1 auVar131 [16];
  undefined1 auVar150 [16];
  undefined6 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [12];
  undefined1 auVar27 [16];
  undefined6 uVar38;
  undefined8 uVar39;
  undefined1 auVar40 [12];
  undefined1 auVar42 [16];
  undefined6 uVar53;
  undefined8 uVar54;
  undefined1 auVar55 [12];
  undefined1 auVar57 [16];
  undefined6 uVar69;
  undefined8 uVar70;
  undefined1 auVar71 [12];
  undefined1 auVar73 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  
  sVar1 = (short)(*in)[0];
  sVar4 = *(short *)((long)*in + 2);
  sVar5 = *(short *)((long)*in + 4);
  sVar6 = *(short *)((long)*in + 6);
  sVar7 = (short)(*in)[1];
  sVar8 = *(short *)((long)*in + 10);
  sVar9 = *(short *)((long)*in + 0xc);
  sVar10 = *(short *)((long)*in + 0xe);
  sVar21 = (short)in[1][0];
  sVar29 = *(short *)((long)in[1] + 2);
  sVar30 = *(short *)((long)in[1] + 4);
  sVar31 = *(short *)((long)in[1] + 6);
  sVar32 = (short)in[1][1];
  sVar33 = *(short *)((long)in[1] + 10);
  sVar34 = *(short *)((long)in[1] + 0xc);
  sVar35 = *(short *)((long)in[1] + 0xe);
  sVar67 = (short)in[2][0];
  sVar76 = *(short *)((long)in[2] + 2);
  sVar77 = *(short *)((long)in[2] + 4);
  sVar78 = *(short *)((long)in[2] + 6);
  sVar79 = (short)in[2][1];
  sVar80 = *(short *)((long)in[2] + 10);
  sVar81 = *(short *)((long)in[2] + 0xc);
  sVar82 = *(short *)((long)in[2] + 0xe);
  sVar36 = (short)in[3][0];
  sVar44 = *(short *)((long)in[3] + 2);
  sVar45 = *(short *)((long)in[3] + 4);
  sVar46 = *(short *)((long)in[3] + 6);
  sVar47 = (short)in[3][1];
  sVar48 = *(short *)((long)in[3] + 10);
  sVar49 = *(short *)((long)in[3] + 0xc);
  sVar50 = *(short *)((long)in[3] + 0xe);
  sVar92 = (short)in[4][0];
  sVar101 = *(short *)((long)in[4] + 2);
  sVar102 = *(short *)((long)in[4] + 4);
  sVar103 = *(short *)((long)in[4] + 6);
  sVar104 = (short)in[4][1];
  sVar105 = *(short *)((long)in[4] + 10);
  sVar106 = *(short *)((long)in[4] + 0xc);
  sVar107 = *(short *)((long)in[4] + 0xe);
  sVar83 = (short)in[5][0];
  sVar85 = *(short *)((long)in[5] + 2);
  sVar86 = *(short *)((long)in[5] + 4);
  sVar87 = *(short *)((long)in[5] + 6);
  sVar88 = (short)in[5][1];
  sVar89 = *(short *)((long)in[5] + 10);
  sVar90 = *(short *)((long)in[5] + 0xc);
  sVar91 = *(short *)((long)in[5] + 0xe);
  sVar51 = (short)in[6][0];
  sVar60 = *(short *)((long)in[6] + 2);
  sVar61 = *(short *)((long)in[6] + 4);
  sVar62 = *(short *)((long)in[6] + 6);
  sVar63 = (short)in[6][1];
  sVar64 = *(short *)((long)in[6] + 10);
  sVar65 = *(short *)((long)in[6] + 0xc);
  sVar66 = *(short *)((long)in[6] + 0xe);
  sVar130 = (short)in[7][0];
  sVar137 = *(short *)((long)in[7] + 2);
  sVar139 = *(short *)((long)in[7] + 4);
  sVar141 = *(short *)((long)in[7] + 6);
  sVar143 = (short)in[7][1];
  sVar145 = *(short *)((long)in[7] + 10);
  sVar147 = *(short *)((long)in[7] + 0xc);
  sVar149 = *(short *)((long)in[7] + 0xe);
  sVar11 = sVar21 + sVar1;
  sVar14 = sVar29 + sVar4;
  sVar15 = sVar30 + sVar5;
  sVar16 = sVar31 + sVar6;
  sVar17 = sVar32 + sVar7;
  sVar18 = sVar33 + sVar8;
  sVar19 = sVar34 + sVar9;
  sVar20 = sVar35 + sVar10;
  sVar1 = sVar1 - sVar21;
  sVar4 = sVar4 - sVar29;
  sVar5 = sVar5 - sVar30;
  sVar6 = sVar6 - sVar31;
  sVar7 = sVar7 - sVar32;
  sVar8 = sVar8 - sVar33;
  sVar9 = sVar9 - sVar34;
  sVar10 = sVar10 - sVar35;
  sVar129 = sVar36 + sVar67;
  sVar136 = sVar44 + sVar76;
  sVar138 = sVar45 + sVar77;
  sVar140 = sVar46 + sVar78;
  sVar142 = sVar47 + sVar79;
  sVar144 = sVar48 + sVar80;
  sVar146 = sVar49 + sVar81;
  sVar148 = sVar50 + sVar82;
  sVar67 = sVar67 - sVar36;
  sVar76 = sVar76 - sVar44;
  sVar77 = sVar77 - sVar45;
  sVar78 = sVar78 - sVar46;
  sVar79 = sVar79 - sVar47;
  sVar80 = sVar80 - sVar48;
  sVar81 = sVar81 - sVar49;
  sVar82 = sVar82 - sVar50;
  sVar115 = sVar83 + sVar92;
  sVar122 = sVar85 + sVar101;
  sVar123 = sVar86 + sVar102;
  sVar124 = sVar87 + sVar103;
  sVar125 = sVar88 + sVar104;
  sVar126 = sVar89 + sVar105;
  sVar127 = sVar90 + sVar106;
  sVar128 = sVar91 + sVar107;
  sVar92 = sVar92 - sVar83;
  sVar101 = sVar101 - sVar85;
  sVar102 = sVar102 - sVar86;
  sVar103 = sVar103 - sVar87;
  sVar104 = sVar104 - sVar88;
  sVar105 = sVar105 - sVar89;
  sVar106 = sVar106 - sVar90;
  sVar107 = sVar107 - sVar91;
  sVar83 = sVar130 + sVar51;
  sVar85 = sVar137 + sVar60;
  sVar86 = sVar139 + sVar61;
  sVar87 = sVar141 + sVar62;
  sVar88 = sVar143 + sVar63;
  sVar89 = sVar145 + sVar64;
  sVar90 = sVar147 + sVar65;
  sVar91 = sVar149 + sVar66;
  sVar51 = sVar51 - sVar130;
  sVar60 = sVar60 - sVar137;
  sVar61 = sVar61 - sVar139;
  sVar62 = sVar62 - sVar141;
  sVar63 = sVar63 - sVar143;
  sVar64 = sVar64 - sVar145;
  sVar65 = sVar65 - sVar147;
  sVar66 = sVar66 - sVar149;
  sVar36 = sVar129 + sVar11;
  sVar44 = sVar136 + sVar14;
  sVar45 = sVar138 + sVar15;
  sVar46 = sVar140 + sVar16;
  sVar47 = sVar142 + sVar17;
  sVar48 = sVar144 + sVar18;
  sVar49 = sVar146 + sVar19;
  sVar50 = sVar148 + sVar20;
  sVar21 = sVar67 + sVar1;
  sVar29 = sVar76 + sVar4;
  sVar30 = sVar77 + sVar5;
  sVar31 = sVar78 + sVar6;
  sVar32 = sVar79 + sVar7;
  sVar33 = sVar80 + sVar8;
  sVar34 = sVar81 + sVar9;
  sVar35 = sVar82 + sVar10;
  sVar11 = sVar11 - sVar129;
  sVar14 = sVar14 - sVar136;
  sVar15 = sVar15 - sVar138;
  sVar16 = sVar16 - sVar140;
  sVar17 = sVar17 - sVar142;
  sVar18 = sVar18 - sVar144;
  sVar19 = sVar19 - sVar146;
  sVar20 = sVar20 - sVar148;
  sVar1 = sVar1 - sVar67;
  sVar4 = sVar4 - sVar76;
  sVar5 = sVar5 - sVar77;
  sVar6 = sVar6 - sVar78;
  sVar7 = sVar7 - sVar79;
  sVar8 = sVar8 - sVar80;
  sVar9 = sVar9 - sVar81;
  sVar10 = sVar10 - sVar82;
  sVar130 = sVar83 + sVar115;
  sVar137 = sVar85 + sVar122;
  sVar139 = sVar86 + sVar123;
  sVar141 = sVar87 + sVar124;
  sVar143 = sVar88 + sVar125;
  sVar145 = sVar89 + sVar126;
  sVar147 = sVar90 + sVar127;
  sVar149 = sVar91 + sVar128;
  sVar129 = sVar51 + sVar92;
  sVar136 = sVar60 + sVar101;
  sVar138 = sVar61 + sVar102;
  sVar140 = sVar62 + sVar103;
  sVar142 = sVar63 + sVar104;
  sVar144 = sVar64 + sVar105;
  sVar146 = sVar65 + sVar106;
  sVar148 = sVar66 + sVar107;
  sVar115 = sVar115 - sVar83;
  sVar122 = sVar122 - sVar85;
  sVar123 = sVar123 - sVar86;
  sVar124 = sVar124 - sVar87;
  sVar125 = sVar125 - sVar88;
  sVar126 = sVar126 - sVar89;
  sVar127 = sVar127 - sVar90;
  sVar128 = sVar128 - sVar91;
  sVar92 = sVar92 - sVar51;
  sVar101 = sVar101 - sVar60;
  sVar102 = sVar102 - sVar61;
  sVar103 = sVar103 - sVar62;
  sVar104 = sVar104 - sVar63;
  sVar105 = sVar105 - sVar64;
  sVar106 = sVar106 - sVar65;
  sVar107 = sVar107 - sVar66;
  sVar80 = sVar130 + sVar36;
  sVar81 = sVar137 + sVar44;
  uVar68 = CONCAT22(sVar81,sVar80);
  sVar82 = sVar139 + sVar45;
  uVar69 = CONCAT24(sVar82,uVar68);
  sVar83 = sVar141 + sVar46;
  uVar70 = CONCAT26(sVar83,uVar69);
  sVar85 = sVar143 + sVar47;
  auVar71._0_10_ = CONCAT28(sVar85,uVar70);
  auVar71._10_2_ = sVar145 + sVar48;
  alVar75[1]._4_2_ = sVar147 + sVar49;
  alVar75._0_12_ = auVar71;
  alVar75[1]._6_2_ = sVar149 + sVar50;
  alVar84[0]._0_2_ = sVar129 + sVar21;
  alVar84[0]._2_2_ = sVar136 + sVar29;
  alVar84[0]._4_2_ = sVar138 + sVar30;
  alVar84[0]._6_2_ = sVar140 + sVar31;
  alVar84[1]._0_2_ = sVar142 + sVar32;
  alVar84[1]._2_2_ = sVar144 + sVar33;
  alVar84[1]._4_2_ = sVar146 + sVar34;
  alVar84[1]._6_2_ = sVar148 + sVar35;
  alVar100[0]._0_2_ = sVar115 + sVar11;
  alVar100[0]._2_2_ = sVar122 + sVar14;
  alVar100[0]._4_2_ = sVar123 + sVar15;
  alVar100[0]._6_2_ = sVar124 + sVar16;
  alVar100[1]._0_2_ = sVar125 + sVar17;
  alVar100[1]._2_2_ = sVar126 + sVar18;
  alVar100[1]._4_2_ = sVar127 + sVar19;
  alVar100[1]._6_2_ = sVar128 + sVar20;
  sVar67 = sVar92 + sVar1;
  sVar76 = sVar101 + sVar4;
  uVar52 = CONCAT22(sVar76,sVar67);
  sVar77 = sVar102 + sVar5;
  uVar53 = CONCAT24(sVar77,uVar52);
  sVar78 = sVar103 + sVar6;
  uVar54 = CONCAT26(sVar78,uVar53);
  sVar79 = sVar104 + sVar7;
  auVar55._0_10_ = CONCAT28(sVar79,uVar54);
  auVar55._10_2_ = sVar105 + sVar8;
  alVar59[1]._4_2_ = sVar106 + sVar9;
  alVar59._0_12_ = auVar55;
  alVar59[1]._6_2_ = sVar107 + sVar10;
  sVar36 = sVar36 - sVar130;
  sVar44 = sVar44 - sVar137;
  uVar37 = CONCAT22(sVar44,sVar36);
  sVar45 = sVar45 - sVar139;
  uVar38 = CONCAT24(sVar45,uVar37);
  sVar46 = sVar46 - sVar141;
  uVar39 = CONCAT26(sVar46,uVar38);
  sVar47 = sVar47 - sVar143;
  auVar40._0_10_ = CONCAT28(sVar47,uVar39);
  auVar40._10_2_ = sVar48 - sVar145;
  alVar43[1]._4_2_ = sVar49 - sVar147;
  alVar43._0_12_ = auVar40;
  alVar43[1]._6_2_ = sVar50 - sVar149;
  sVar21 = sVar21 - sVar129;
  sVar29 = sVar29 - sVar136;
  uVar22 = CONCAT22(sVar29,sVar21);
  sVar30 = sVar30 - sVar138;
  uVar23 = CONCAT24(sVar30,uVar22);
  sVar31 = sVar31 - sVar140;
  uVar24 = CONCAT26(sVar31,uVar23);
  sVar32 = sVar32 - sVar142;
  auVar25._0_10_ = CONCAT28(sVar32,uVar24);
  auVar25._10_2_ = sVar33 - sVar144;
  alVar28[1]._4_2_ = sVar34 - sVar146;
  alVar28._0_12_ = auVar25;
  alVar28[1]._6_2_ = sVar35 - sVar148;
  alVar13[0]._0_2_ = sVar11 - sVar115;
  alVar13[0]._2_2_ = sVar14 - sVar122;
  alVar13[0]._4_2_ = sVar15 - sVar123;
  alVar13[0]._6_2_ = sVar16 - sVar124;
  alVar13[1]._0_2_ = sVar17 - sVar125;
  alVar13[1]._2_2_ = sVar18 - sVar126;
  alVar13[1]._4_2_ = sVar19 - sVar127;
  alVar13[1]._6_2_ = sVar20 - sVar128;
  alVar3[0]._0_2_ = sVar1 - sVar92;
  alVar3[0]._2_2_ = sVar4 - sVar101;
  alVar3[0]._4_2_ = sVar5 - sVar102;
  alVar3[0]._6_2_ = sVar6 - sVar103;
  alVar3[1]._0_2_ = sVar7 - sVar104;
  alVar3[1]._2_2_ = sVar8 - sVar105;
  alVar3[1]._4_2_ = sVar9 - sVar106;
  alVar3[1]._6_2_ = sVar10 - sVar107;
  if (iter == 0) {
    auVar120._12_2_ = sVar46;
    auVar120._0_12_ = auVar40;
    auVar120._14_2_ = alVar100[0]._6_2_;
    auVar119._12_4_ = auVar120._12_4_;
    auVar119._10_2_ = alVar100[0]._4_2_;
    auVar119._0_10_ = auVar40._0_10_;
    auVar118._10_6_ = auVar119._10_6_;
    auVar118._8_2_ = sVar45;
    auVar118._0_8_ = uVar39;
    auVar117._8_8_ = auVar118._8_8_;
    auVar117._6_2_ = alVar100[0]._2_2_;
    auVar117._0_6_ = uVar38;
    auVar116._6_10_ = auVar117._6_10_;
    auVar116._4_2_ = sVar44;
    auVar116._0_4_ = uVar37;
    alVar75[0]._6_2_ = (short)alVar100[0];
    alVar75[0]._4_2_ = sVar36;
    uVar37 = CONCAT22((short)alVar100[1],sVar47);
    uVar38 = CONCAT24(auVar40._10_2_,uVar37);
    auVar41._0_8_ = CONCAT26(alVar100[1]._2_2_,uVar38);
    auVar41._8_2_ = alVar43[1]._4_2_;
    auVar41._10_2_ = alVar100[1]._4_2_;
    auVar42._12_2_ = alVar43[1]._6_2_;
    auVar42._0_12_ = auVar41;
    auVar42._14_2_ = alVar100[1]._6_2_;
    auVar98._12_2_ = sVar83;
    auVar98._0_12_ = auVar71;
    auVar98._14_2_ = alVar13[0]._6_2_;
    auVar97._12_4_ = auVar98._12_4_;
    auVar97._10_2_ = alVar13[0]._4_2_;
    auVar97._0_10_ = auVar71._0_10_;
    auVar96._10_6_ = auVar97._10_6_;
    auVar96._8_2_ = sVar82;
    auVar96._0_8_ = uVar70;
    auVar95._8_8_ = auVar96._8_8_;
    auVar95._6_2_ = alVar13[0]._2_2_;
    auVar95._0_6_ = uVar69;
    auVar94._6_10_ = auVar95._6_10_;
    auVar94._4_2_ = sVar81;
    auVar94._0_4_ = uVar68;
    auVar93._4_12_ = auVar94._4_12_;
    auVar93._0_4_ = CONCAT22((short)alVar13[0],sVar80);
    uVar68 = CONCAT22((short)alVar13[1],sVar85);
    uVar38 = CONCAT24(auVar71._10_2_,uVar68);
    auVar72._0_8_ = CONCAT26(alVar13[1]._2_2_,uVar38);
    auVar72._8_2_ = alVar75[1]._4_2_;
    auVar72._10_2_ = alVar13[1]._4_2_;
    auVar73._12_2_ = alVar75[1]._6_2_;
    auVar73._0_12_ = auVar72;
    auVar73._14_2_ = alVar13[1]._6_2_;
    auVar113._12_2_ = sVar78;
    auVar113._0_12_ = auVar55;
    auVar113._14_2_ = alVar3[0]._6_2_;
    auVar112._12_4_ = auVar113._12_4_;
    auVar112._10_2_ = alVar3[0]._4_2_;
    auVar112._0_10_ = auVar55._0_10_;
    auVar111._10_6_ = auVar112._10_6_;
    auVar111._8_2_ = sVar77;
    auVar111._0_8_ = uVar54;
    auVar110._8_8_ = auVar111._8_8_;
    auVar110._6_2_ = alVar3[0]._2_2_;
    auVar110._0_6_ = uVar53;
    auVar109._6_10_ = auVar110._6_10_;
    auVar109._4_2_ = sVar76;
    auVar109._0_4_ = uVar52;
    auVar108._4_12_ = auVar109._4_12_;
    auVar108._0_4_ = CONCAT22((short)alVar3[0],sVar67);
    auVar135._12_2_ = sVar31;
    auVar135._0_12_ = auVar25;
    auVar135._14_2_ = alVar84[0]._6_2_;
    auVar134._12_4_ = auVar135._12_4_;
    auVar134._10_2_ = alVar84[0]._4_2_;
    auVar134._0_10_ = auVar25._0_10_;
    auVar133._10_6_ = auVar134._10_6_;
    auVar133._8_2_ = sVar30;
    auVar133._0_8_ = uVar24;
    auVar132._8_8_ = auVar133._8_8_;
    auVar132._6_2_ = alVar84[0]._2_2_;
    auVar132._0_6_ = uVar23;
    auVar131._6_10_ = auVar132._6_10_;
    auVar131._4_2_ = sVar29;
    auVar131._0_4_ = uVar22;
    alVar75[1]._6_2_ = (short)alVar84[0];
    alVar75[1]._4_2_ = sVar21;
    uVar52 = CONCAT22((short)alVar3[1],sVar79);
    uVar23 = CONCAT24(auVar55._10_2_,uVar52);
    auVar56._0_8_ = CONCAT26(alVar3[1]._2_2_,uVar23);
    auVar56._8_2_ = alVar59[1]._4_2_;
    auVar56._10_2_ = alVar3[1]._4_2_;
    auVar57._12_2_ = alVar59[1]._6_2_;
    auVar57._0_12_ = auVar56;
    auVar57._14_2_ = alVar3[1]._6_2_;
    uVar22 = CONCAT22((short)alVar84[1],sVar32);
    uVar23 = CONCAT24(auVar25._10_2_,uVar22);
    auVar26._0_8_ = CONCAT26(alVar84[1]._2_2_,uVar23);
    auVar26._8_2_ = alVar28[1]._4_2_;
    auVar26._10_2_ = alVar84[1]._4_2_;
    auVar27._12_2_ = alVar28[1]._6_2_;
    auVar27._0_12_ = auVar26;
    auVar27._14_2_ = alVar84[1]._6_2_;
    auVar12._0_8_ = auVar93._0_8_;
    auVar12._8_4_ = auVar94._4_4_;
    auVar12._12_4_ = auVar116._4_4_;
    alVar75[0]._0_4_ = auVar93._0_4_;
    auVar150._0_8_ = auVar108._0_8_;
    auVar150._8_4_ = auVar109._4_4_;
    auVar150._12_4_ = auVar131._4_4_;
    alVar75[1]._0_4_ = auVar108._0_4_;
    auVar99._0_8_ = CONCAT44(auVar118._8_4_,auVar96._8_4_);
    auVar99._8_4_ = auVar97._12_4_;
    auVar99._12_4_ = auVar119._12_4_;
    auVar114._0_8_ = CONCAT44(auVar133._8_4_,auVar111._8_4_);
    auVar114._8_4_ = auVar112._12_4_;
    auVar114._12_4_ = auVar134._12_4_;
    auVar2._8_4_ = (int)((ulong)auVar72._0_8_ >> 0x20);
    auVar2._0_8_ = auVar72._0_8_;
    auVar2._12_4_ = (int)((ulong)auVar41._0_8_ >> 0x20);
    alVar59[0]._4_4_ = uVar37;
    alVar59[0]._0_4_ = uVar68;
    auVar121._8_4_ = (int)((ulong)auVar56._0_8_ >> 0x20);
    auVar121._0_8_ = auVar56._0_8_;
    auVar121._12_4_ = (int)((ulong)auVar26._0_8_ >> 0x20);
    alVar59[1]._4_4_ = uVar22;
    alVar59[1]._0_4_ = uVar52;
    auVar74._0_8_ = CONCAT44(auVar41._8_4_,auVar72._8_4_);
    auVar74._8_4_ = auVar73._12_4_;
    auVar74._12_4_ = auVar42._12_4_;
    auVar58._0_8_ = CONCAT44(auVar26._8_4_,auVar56._8_4_);
    auVar58._8_4_ = auVar57._12_4_;
    auVar58._12_4_ = auVar27._12_4_;
    alVar13[1] = auVar150._8_8_;
    alVar13[0] = auVar12._8_8_;
    alVar43[1] = auVar114._0_8_;
    alVar43[0] = auVar99._0_8_;
    alVar100[1] = auVar114._8_8_;
    alVar100[0] = auVar99._8_8_;
    alVar28[1] = auVar58._0_8_;
    alVar28[0] = auVar74._0_8_;
    alVar84[1] = auVar58._8_8_;
    alVar84[0] = auVar74._8_8_;
    alVar3[1] = auVar121._8_8_;
    alVar3[0] = auVar2._8_8_;
  }
  *in = alVar75;
  in[1] = alVar13;
  in[2] = alVar43;
  in[3] = alVar100;
  in[4] = alVar59;
  in[5] = alVar3;
  in[6] = alVar28;
  in[7] = alVar84;
  return;
}

Assistant:

static inline void hadamard_col8_sse2(__m128i *in, int iter) {
  __m128i a0 = in[0];
  __m128i a1 = in[1];
  __m128i a2 = in[2];
  __m128i a3 = in[3];
  __m128i a4 = in[4];
  __m128i a5 = in[5];
  __m128i a6 = in[6];
  __m128i a7 = in[7];

  __m128i b0 = _mm_add_epi16(a0, a1);
  __m128i b1 = _mm_sub_epi16(a0, a1);
  __m128i b2 = _mm_add_epi16(a2, a3);
  __m128i b3 = _mm_sub_epi16(a2, a3);
  __m128i b4 = _mm_add_epi16(a4, a5);
  __m128i b5 = _mm_sub_epi16(a4, a5);
  __m128i b6 = _mm_add_epi16(a6, a7);
  __m128i b7 = _mm_sub_epi16(a6, a7);

  a0 = _mm_add_epi16(b0, b2);
  a1 = _mm_add_epi16(b1, b3);
  a2 = _mm_sub_epi16(b0, b2);
  a3 = _mm_sub_epi16(b1, b3);
  a4 = _mm_add_epi16(b4, b6);
  a5 = _mm_add_epi16(b5, b7);
  a6 = _mm_sub_epi16(b4, b6);
  a7 = _mm_sub_epi16(b5, b7);

  if (iter == 0) {
    b0 = _mm_add_epi16(a0, a4);
    b7 = _mm_add_epi16(a1, a5);
    b3 = _mm_add_epi16(a2, a6);
    b4 = _mm_add_epi16(a3, a7);
    b2 = _mm_sub_epi16(a0, a4);
    b6 = _mm_sub_epi16(a1, a5);
    b1 = _mm_sub_epi16(a2, a6);
    b5 = _mm_sub_epi16(a3, a7);

    a0 = _mm_unpacklo_epi16(b0, b1);
    a1 = _mm_unpacklo_epi16(b2, b3);
    a2 = _mm_unpackhi_epi16(b0, b1);
    a3 = _mm_unpackhi_epi16(b2, b3);
    a4 = _mm_unpacklo_epi16(b4, b5);
    a5 = _mm_unpacklo_epi16(b6, b7);
    a6 = _mm_unpackhi_epi16(b4, b5);
    a7 = _mm_unpackhi_epi16(b6, b7);

    b0 = _mm_unpacklo_epi32(a0, a1);
    b1 = _mm_unpacklo_epi32(a4, a5);
    b2 = _mm_unpackhi_epi32(a0, a1);
    b3 = _mm_unpackhi_epi32(a4, a5);
    b4 = _mm_unpacklo_epi32(a2, a3);
    b5 = _mm_unpacklo_epi32(a6, a7);
    b6 = _mm_unpackhi_epi32(a2, a3);
    b7 = _mm_unpackhi_epi32(a6, a7);

    in[0] = _mm_unpacklo_epi64(b0, b1);
    in[1] = _mm_unpackhi_epi64(b0, b1);
    in[2] = _mm_unpacklo_epi64(b2, b3);
    in[3] = _mm_unpackhi_epi64(b2, b3);
    in[4] = _mm_unpacklo_epi64(b4, b5);
    in[5] = _mm_unpackhi_epi64(b4, b5);
    in[6] = _mm_unpacklo_epi64(b6, b7);
    in[7] = _mm_unpackhi_epi64(b6, b7);
  } else {
    in[0] = _mm_add_epi16(a0, a4);
    in[7] = _mm_add_epi16(a1, a5);
    in[3] = _mm_add_epi16(a2, a6);
    in[4] = _mm_add_epi16(a3, a7);
    in[2] = _mm_sub_epi16(a0, a4);
    in[6] = _mm_sub_epi16(a1, a5);
    in[1] = _mm_sub_epi16(a2, a6);
    in[5] = _mm_sub_epi16(a3, a7);
  }
}